

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void suffixedexp(LexState *ls,expdesc *v)

{
  int line_00;
  int iVar1;
  FuncState *fs_00;
  undefined1 local_58 [8];
  expdesc key_1;
  expdesc key;
  int line;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  line_00 = ls->linenumber;
  primaryexp(ls,v);
LAB_0011c453:
  do {
    while (iVar1 = (ls->t).token, iVar1 == 0x28) {
LAB_0011c51b:
      luaK_exp2nextreg(fs_00,v);
      funcargs(ls,v,line_00);
    }
    if (iVar1 != 0x2e) {
      if (iVar1 == 0x3a) {
        luaX_next(ls);
        checkname(ls,(expdesc *)local_58);
        luaK_self(fs_00,v,(expdesc *)local_58);
        funcargs(ls,v,line_00);
      }
      else {
        if (iVar1 != 0x5b) {
          if ((iVar1 != 0x7b) && (iVar1 != 0x125)) {
            return;
          }
          goto LAB_0011c51b;
        }
        luaK_exp2anyregup(fs_00,v);
        yindex(ls,(expdesc *)&key_1.t);
        luaK_indexed(fs_00,v,(expdesc *)&key_1.t);
      }
      goto LAB_0011c453;
    }
    fieldsel(ls,v);
  } while( true );
}

Assistant:

static void suffixedexp(LexState *ls, expdesc *v) {
    /* suffixedexp ->
         primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
    FuncState *fs = ls->fs;
    int line = ls->linenumber;
    primaryexp(ls, v);
    for (;;) {
        switch (ls->t.token) {
            case '.': {  /* fieldsel */
                fieldsel(ls, v);
                break;
            }
            case '[': {  /* '[' exp1 ']' */
                expdesc key;
                luaK_exp2anyregup(fs, v);
                yindex(ls, &key);
                luaK_indexed(fs, v, &key);
                break;
            }
            case ':': {  /* ':' NAME funcargs */
                expdesc key;
                luaX_next(ls);
                checkname(ls, &key);
                luaK_self(fs, v, &key);
                funcargs(ls, v, line);
                break;
            }
            case '(':
            case TK_STRING:
            case '{': {  /* funcargs */
                luaK_exp2nextreg(fs, v);
                funcargs(ls, v, line);
                break;
            }
            default:
                return;
        }
    }
}